

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.c
# Opt level: O0

void glfwGetCursorPos(GLFWwindow *handle,double *xpos,double *ypos)

{
  double *in_RDX;
  double *in_RSI;
  _GLFWwindow *in_RDI;
  _GLFWwindow *window;
  
  if (in_RSI != (double *)0x0) {
    *in_RSI = 0.0;
  }
  if (in_RDX != (double *)0x0) {
    *in_RDX = 0.0;
  }
  if (_glfw.initialized == 0) {
    _glfwInputError(0x10001,(char *)0x0);
  }
  else if (in_RDI->cursorMode == 0x34003) {
    if (in_RSI != (double *)0x0) {
      *in_RSI = in_RDI->virtualCursorPosX;
    }
    if (in_RDX != (double *)0x0) {
      *in_RDX = in_RDI->virtualCursorPosY;
    }
  }
  else {
    (*_glfw.platform.getCursorPos)(in_RDI,in_RSI,in_RDX);
  }
  return;
}

Assistant:

GLFWAPI void glfwGetCursorPos(GLFWwindow* handle, double* xpos, double* ypos)
{
    _GLFWwindow* window = (_GLFWwindow*) handle;
    assert(window != NULL);

    if (xpos)
        *xpos = 0;
    if (ypos)
        *ypos = 0;

    _GLFW_REQUIRE_INIT();

    if (window->cursorMode == GLFW_CURSOR_DISABLED)
    {
        if (xpos)
            *xpos = window->virtualCursorPosX;
        if (ypos)
            *ypos = window->virtualCursorPosY;
    }
    else
        _glfw.platform.getCursorPos(window, xpos, ypos);
}